

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

bool __thiscall
SQCompilation::FunctionReturnTypeEvaluator::checkNode
          (FunctionReturnTypeEvaluator *this,Statement *n)

{
  byte *pbVar1;
  TreeOp TVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  
  bVar5 = 1;
  while (TVar2 = (((SwitchStatement *)n)->super_Statement).super_Node._op, TVar2 - TO_WHILE < 4) {
    n = (Statement *)((SwitchStatement *)n)->_expr;
    bVar5 = 0;
  }
  switch(TVar2) {
  case TO_BLOCK:
    bVar4 = checkBlock(this,(Block *)n);
    break;
  case TO_IF:
    bVar4 = checkIf(this,(IfStatement *)n);
    break;
  default:
    bVar4 = false;
    break;
  case TO_SWITCH:
    bVar4 = checkSwitch(this,(SwitchStatement *)n);
    break;
  case TO_RETURN:
    if (((SwitchStatement *)n)->_expr == (Expr *)0x0) {
      *(byte *)&this->flags = (byte)this->flags | 1;
    }
    else {
      checkExpr(this,((SwitchStatement *)n)->_expr);
    }
    goto LAB_0014defb;
  case TO_THROW:
    pbVar1 = (byte *)((long)&this->flags + 1);
    *pbVar1 = *pbVar1 | 4;
LAB_0014defb:
    bVar4 = true;
    break;
  case TO_TRY:
    bVar3 = checkNode(this,(Statement *)((SwitchStatement *)n)->_expr);
    bVar4 = checkNode(this,(Statement *)(((SwitchStatement *)n)->_cases)._vals);
    bVar4 = bVar4 && bVar3;
  }
  return (bool)(bVar5 & bVar4);
}

Assistant:

bool FunctionReturnTypeEvaluator::checkNode(const Statement *n) {
  switch (n->op())
  {
  case TO_RETURN: return checkReturn(static_cast<const ReturnStatement *>(n));
  case TO_THROW: return checkThrow(static_cast<const ThrowStatement *>(n));
  case TO_FOR: case TO_FOREACH: case TO_WHILE: case TO_DOWHILE:
    return checkLoop(static_cast<const LoopStatement *>(n));
  case TO_IF: return checkIf(static_cast<const IfStatement *>(n));
  case TO_SWITCH: return checkSwitch(static_cast<const SwitchStatement *>(n));
  case TO_BLOCK: return checkBlock(static_cast<const Block *>(n));
  case TO_TRY: return checkTry(static_cast<const TryStatement *>(n));
  default:
    return false;
  }
}